

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall
ICM::Compiler::InstructionCreater::createNodePrintIdent
          (InstructionCreater *this,Node *node,Element *refelt)

{
  anon_union_4_2_4727c1b0_for_Element_0 *paVar1;
  iterator __position;
  InstructionData *instdata;
  Node *node_00;
  Element *e;
  anon_union_4_2_4727c1b0_for_Element_0 *elt;
  anon_union_4_2_4727c1b0_for_Element_0 local_40;
  undefined4 uStack_3c;
  uint_t uStack_38;
  
  instdata = (InstructionData *)operator_new(0x28);
  instdata->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata->Inst = 0;
  instdata[1]._vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata[1].Inst = 0;
  instdata[2]._vptr_InstructionData = (_func_int **)0x0;
  instdata->Inst = pti;
  instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151ff8;
  paVar1 = (anon_union_4_2_4727c1b0_for_Element_0 *)
           (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_finish;
  elt = (anon_union_4_2_4727c1b0_for_Element_0 *)
        ((node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
         super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl.
         super__Vector_impl_data._M_start + 1);
  if (elt < paVar1) {
    do {
      if ((((anon_union_4_2_4727c1b0_for_Element_0 *)&(elt->field_0).etype)->field_0).etype ==
          '\x02') {
        node_00 = AnalysisBase::GetRefer(&this->super_AnalysisBase,(Element *)&elt->field_0);
        createNode(this,node_00,(Element *)&elt->field_0);
      }
      local_40 = (anon_union_4_2_4727c1b0_for_Element_0)elt->type;
      uStack_38 = *(uint_t *)(elt + 2);
      __position._M_current = *(Element **)&instdata[1].Inst;
      if (__position._M_current == (Element *)instdata[2]._vptr_InstructionData) {
        std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>::
        _M_realloc_insert<ICM::Instruction::Element>
                  ((vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *)
                   (instdata + 1),__position,(Element *)&local_40.field_0);
      }
      else {
        *(ulong *)__position._M_current = CONCAT44(uStack_3c,local_40.type);
        (__position._M_current)->index = uStack_38;
        *(long *)&instdata[1].Inst = *(long *)&instdata[1].Inst + 0x10;
      }
      elt = elt + 4;
    } while (elt != paVar1);
  }
  Instruction::InstructionList::push(&this->InstList,instdata);
  if ((refelt->field_0).field_0.etype == '\x02') {
    refelt->index =
         ((long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    return true;
  }
  __assert_fail("isRefer()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
}

Assistant:

bool createNodePrintIdent(Node &node, Element &refelt) {
				Insts::PrintIdent *inst = new Insts::PrintIdent();
				for (auto &e : rangei(node.begin() + 1, node.end())) {
					if (e.isRefer())
						createNode(GetRefer(e), e);
					inst->Args.push_back(ConvertToInstElement(e));
				}
				InstList.push(inst);
				refelt.setRefer(CurrInstID());
				return true;
			}